

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

stbtt_uint32 stbtt__buf_get(stbtt__buf *b,int n)

{
  byte bVar1;
  stbtt_uint32 sVar2;
  bool bVar3;
  
  sVar2 = 0;
  if (n < 1) {
    n = sVar2;
  }
  while (bVar3 = n != 0, n = n - 1, bVar3) {
    bVar1 = stbtt__buf_get8(b);
    sVar2 = sVar2 << 8 | (uint)bVar1;
  }
  return sVar2;
}

Assistant:

static stbtt_uint32 stbtt__buf_get(stbtt__buf *b, int n)
{
   stbtt_uint32 v = 0;
   int i;
   STBTT_assert(n >= 1 && n <= 4);
   for (i = 0; i < n; i++)
      v = (v << 8) | stbtt__buf_get8(b);
   return v;
}